

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O0

Cards * __thiscall
DeckOfCards::draw(Cards *__return_storage_ptr__,DeckOfCards *this,Cards *pickedCard)

{
  vector<Cards,_std::allocator<Cards>_> *pvVar1;
  code *pcVar2;
  bool bVar3;
  reference pCVar4;
  __normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_> local_e0;
  __normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_> local_d8;
  __normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_> local_d0;
  const_iterator local_c8;
  undefined1 local_b0 [8];
  Cards card;
  iterator __end1;
  iterator __begin1;
  vector<Cards,_std::allocator<Cards>_> *__range1;
  int index;
  Cards *pickedCard_local;
  DeckOfCards *this_local;
  
  __range1._4_4_ = 0;
  pvVar1 = this->deck;
  __end1 = std::vector<Cards,_std::allocator<Cards>_>::begin(pvVar1);
  card.it._M_current = (int *)std::vector<Cards,_std::allocator<Cards>_>::end(pvVar1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>
                                *)&card.it);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pCVar4 = __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::
             operator*(&__end1);
    Cards::Cards((Cards *)local_b0,pCVar4);
    bVar3 = Cards::operator==((Cards *)local_b0,pickedCard);
    if (bVar3) {
      pvVar1 = this->deck;
      local_e0._M_current = (Cards *)std::vector<Cards,_std::allocator<Cards>_>::end(pvVar1);
      local_d8 = __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>
                 ::operator-(&local_e0,1);
      local_d0 = __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>
                 ::operator-(&local_d8,(long)__range1._4_4_);
      __gnu_cxx::__normal_iterator<Cards_const*,std::vector<Cards,std::allocator<Cards>>>::
      __normal_iterator<Cards*>
                ((__normal_iterator<Cards_const*,std::vector<Cards,std::allocator<Cards>>> *)
                 &local_c8,&local_d0);
      std::vector<Cards,_std::allocator<Cards>_>::erase(pvVar1,local_c8);
      std::vector<Cards,_std::allocator<Cards>_>::push_back(this->discardedDeck,pickedCard);
      Cards::Cards(__return_storage_ptr__,pickedCard);
    }
    else {
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    Cards::~Cards((Cards *)local_b0);
    if (bVar3) break;
    __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Cards DeckOfCards::draw(Cards pickedCard) {
    int index=0;
    for(Cards card : *deck){
        if(card == pickedCard){
        deck->erase(deck->end() - 1 - index);
        discardedDeck->push_back(pickedCard);
        return pickedCard;
        }
        else {
            index++;
        }
    }
}